

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNetlist.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkToNetlistBench(Abc_Ntk_t *pNtk)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  Abc_Ntk_t *pNtk_00;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  char *pcVar6;
  Abc_Ntk_t *pAVar7;
  long lVar8;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    iVar2 = Abc_NtkGetChoiceNum(pNtk);
    if (iVar2 != 0) {
      puts("Warning: Choice nodes are skipped.");
    }
    pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_SOP);
    p = Abc_NtkDfs(pNtk,0);
    pAVar4 = Abc_AigConst1(pNtk);
    if (0 < (pAVar4->vFanouts).nSize) {
      pAVar5 = Abc_NtkCreateNodeConst1(pNtk_00);
      (pAVar4->field_6).pCopy = pAVar5;
    }
    iVar2 = Abc_AigNodeHasComplFanoutEdgeTrav(pAVar4);
    if (iVar2 != 0) {
      pAVar5 = Abc_NtkCreateNodeInv(pNtk_00,(pAVar4->field_6).pCopy);
      (((pAVar4->field_6).pCopy)->field_6).pCopy = pAVar5;
    }
    for (iVar2 = 0; iVar2 < pNtk->vCis->nSize; iVar2 = iVar2 + 1) {
      pAVar4 = Abc_NtkCi(pNtk,iVar2);
      iVar3 = Abc_AigNodeHasComplFanoutEdgeTrav(pAVar4);
      if (iVar3 != 0) {
        pAVar5 = Abc_NtkCreateNodeInv(pNtk_00,(pAVar4->field_6).pCopy);
        (((pAVar4->field_6).pCopy)->field_6).pCopy = pAVar5;
      }
    }
    for (iVar2 = 0; iVar3 = p->nSize, iVar2 < iVar3; iVar2 = iVar2 + 1) {
      pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(p,iVar2);
      Abc_NtkDupObj(pNtk_00,pAVar4,0);
      pcVar6 = Abc_SopCreateAnd((Mem_Flex_t *)pNtk_00->pManFunc,2,(int *)0x0);
      (((pAVar4->field_6).pCopy)->field_5).pData = pcVar6;
      iVar3 = Abc_AigNodeHasComplFanoutEdgeTrav(pAVar4);
      if (iVar3 != 0) {
        pAVar5 = Abc_NtkCreateNodeInv(pNtk_00,(pAVar4->field_6).pCopy);
        (((pAVar4->field_6).pCopy)->field_6).pCopy = pAVar5;
      }
    }
    for (iVar2 = 0; iVar2 < iVar3; iVar2 = iVar2 + 1) {
      pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(p,iVar2);
      for (lVar8 = 0; lVar8 < (pAVar4->vFanins).nSize; lVar8 = lVar8 + 1) {
        pvVar1 = pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanins).pArray[lVar8]];
        iVar3 = Abc_ObjFaninC(pAVar4,(int)lVar8);
        pAVar5 = *(Abc_Obj_t **)((long)pvVar1 + 0x40);
        if (iVar3 != 0) {
          pAVar5 = (pAVar5->field_6).pCopy;
        }
        Abc_ObjAddFanin((pAVar4->field_6).pCopy,pAVar5);
      }
      iVar3 = p->nSize;
    }
    Vec_PtrFree(p);
    for (iVar2 = 0; iVar2 < pNtk->vCos->nSize; iVar2 = iVar2 + 1) {
      pAVar5 = Abc_NtkCo(pNtk,iVar2);
      pAVar4 = *(Abc_Obj_t **)((long)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray] + 0x40);
      if ((pAVar5->field_0x15 & 4) != 0) {
        pAVar4 = (pAVar4->field_6).pCopy;
      }
      Abc_ObjAddFanin((pAVar5->field_6).pCopy,pAVar4);
    }
    Abc_NtkLogicMakeSimpleCos(pNtk_00,0);
    if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
      puts("Warning: The EXDc network is skipped.");
    }
    iVar2 = Abc_NtkCheck(pNtk_00);
    if (iVar2 == 0) {
      fwrite("Abc_NtkAigToLogicSopBench(): Network check has failed.\n",0x37,1,_stdout);
    }
    pAVar7 = Abc_NtkLogicToNetlist(pNtk_00);
    Abc_NtkDelete(pNtk_00);
    return pAVar7;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNetlist.c"
                ,0x80,"Abc_Ntk_t *Abc_NtkToNetlistBench(Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkAigToLogicSop( Abc_Ntk_t * pNtk )
{
    extern int Abc_NtkLogicMakeSimpleCos2( Abc_Ntk_t * pNtk, int fDuplicate );

    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFanin, * pNodeNew;
    Vec_Int_t * vInts;
    int i, k, fChoices = 0;
    assert( Abc_NtkIsStrash(pNtk) );
    // start the network
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_SOP );
    // if the constant node is used, duplicate it
    pObj = Abc_AigConst1(pNtk);
    if ( Abc_ObjFanoutNum(pObj) > 0 )
        pObj->pCopy = Abc_NtkCreateNodeConst1(pNtkNew);
    // duplicate the nodes and create node functions
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        Abc_NtkDupObj(pNtkNew, pObj, 0);
        pObj->pCopy->pData = Abc_SopCreateAnd2( (Mem_Flex_t *)pNtkNew->pManFunc, Abc_ObjFaninC0(pObj), Abc_ObjFaninC1(pObj) );
    }
    // create the choice nodes
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( !Abc_AigNodeIsChoice(pObj) )
            continue;
        // create an OR gate
        pNodeNew = Abc_NtkCreateNode(pNtkNew);
        // add fanins
        vInts = Vec_IntAlloc( 10 );
        for ( pFanin = pObj; pFanin; pFanin = (Abc_Obj_t *)pFanin->pData )
        {
            Vec_IntPush( vInts, (int)(pObj->fPhase != pFanin->fPhase) );
            Abc_ObjAddFanin( pNodeNew, pFanin->pCopy );
        }
        // create the logic function
        pNodeNew->pData = Abc_SopCreateOrMultiCube( (Mem_Flex_t *)pNtkNew->pManFunc, Vec_IntSize(vInts), Vec_IntArray(vInts) );
        // set the new node
        pObj->pCopy->pCopy = pNodeNew;
        Vec_IntFree( vInts );
        fChoices = 1;
    }
    // connect the internal nodes
    Abc_NtkForEachNode( pNtk, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            if ( pFanin->pCopy->pCopy )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy->pCopy );
            else
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
    // connect the COs
//    Abc_NtkFinalize( pNtk, pNtkNew );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pFanin = Abc_ObjFanin0(pObj);
        if ( pFanin->pCopy->pCopy )
            pNodeNew = Abc_ObjNotCond(pFanin->pCopy->pCopy, Abc_ObjFaninC0(pObj));
        else
            pNodeNew = Abc_ObjNotCond(pFanin->pCopy, Abc_ObjFaninC0(pObj));
        Abc_ObjAddFanin( pObj->pCopy, pNodeNew );
    }

    // fix the problem with complemented and duplicated CO edges
    if ( fChoices )
        Abc_NtkLogicMakeSimpleCos2( pNtkNew, 0 );
    else
        Abc_NtkLogicMakeSimpleCos( pNtkNew, 0 );
    // duplicate the EXDC Ntk
    if ( pNtk->pExdc )
    {
        if ( Abc_NtkIsStrash(pNtk->pExdc) )
            pNtkNew->pExdc = Abc_NtkAigToLogicSop( pNtk->pExdc );
        else
            pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );
    }
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkAigToLogicSop(): Network check has failed.\n" );
    return pNtkNew;
}